

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O0

Vec_Str_t *
Super_PrecomputeStr(Mio_Library_t *pLibGen,int nVarsMax,int nLevels,int nGatesMax,float tDelayMax,
                   float tAreaMax,int TimeLimit,int fSkipInv,int fVerbose)

{
  Mio_Gate_t *pMVar1;
  long lVar2;
  abctime aVar3;
  abctime aVar4;
  abctime aVar5;
  Mio_Gate_t *local_70;
  abctime clockStart;
  abctime clk;
  int Level;
  int nGates;
  Mio_Gate_t **ppGates;
  Super_Man_t *pMan;
  Vec_Str_t *vStr;
  int local_30;
  int fSkipInv_local;
  int TimeLimit_local;
  float tAreaMax_local;
  float tDelayMax_local;
  int nGatesMax_local;
  int nLevels_local;
  int nVarsMax_local;
  Mio_Library_t *pLibGen_local;
  
  vStr._4_4_ = fSkipInv;
  local_30 = TimeLimit;
  fSkipInv_local = (int)tAreaMax;
  TimeLimit_local = (int)tDelayMax;
  tAreaMax_local = (float)nGatesMax;
  tDelayMax_local = (float)nLevels;
  nGatesMax_local = nVarsMax;
  _nLevels_local = pLibGen;
  if (nVarsMax < 7) {
    if ((nGatesMax == 0) || (nVarsMax <= nGatesMax)) {
      _Level = Mio_CollectRoots(pLibGen,nVarsMax,tDelayMax,0,(int *)((long)&clk + 4),fVerbose);
      if ((tAreaMax_local != 0.0) && ((int)tAreaMax_local <= clk._4_4_)) {
        fprintf(_stdout,"Warning! Genlib library contains more gates than can be computed.\n");
        fprintf(_stdout,"Only one-gate supergates are included in the supergate library.\n");
      }
      ppGates = (Mio_Gate_t **)Super_ManStart();
      pMVar1 = (Mio_Gate_t *)Mio_LibraryReadName(_nLevels_local);
      *ppGates = pMVar1;
      *(float *)((long)ppGates + 0x14) = tAreaMax_local;
      *(int *)(ppGates + 4) = vStr._4_4_;
      *(int *)(ppGates + 3) = TimeLimit_local;
      *(int *)((long)ppGates + 0x1c) = fSkipInv_local;
      *(int *)(ppGates + 0x1a) = local_30;
      if (local_30 == 0) {
        local_70 = (Mio_Gate_t *)0x0;
      }
      else {
        lVar2 = (long)local_30;
        aVar3 = Abc_Clock();
        local_70 = (Mio_Gate_t *)(lVar2 * 1000000 + aVar3);
      }
      ppGates[0x1b] = local_70;
      *(int *)(ppGates + 5) = fVerbose;
      if (clk._4_4_ == 0) {
        fprintf(_stderr,"Error: No genlib gates satisfy the limits criteria. Stop.\n");
        fprintf(_stderr,"Limits: max delay =  %.2f, max area =  %.2f, time limit = %d sec.\n",
                (double)*(float *)(ppGates + 3),(double)*(float *)((long)ppGates + 0x1c),
                (ulong)*(uint *)(ppGates + 0x1a));
        Super_ManStop((Super_Man_t *)ppGates);
        if (_Level != (Mio_Gate_t **)0x0) {
          free(_Level);
        }
        pLibGen_local = (Mio_Library_t *)0x0;
      }
      else {
        Super_First((Super_Man_t *)ppGates,nGatesMax_local);
        aVar3 = Abc_Clock();
        if (fVerbose != 0) {
          printf("Computing supergates with %d inputs, %d levels, and %d max gates.\n",
                 (ulong)*(uint *)(ppGates + 1),(ulong)(uint)tDelayMax_local,
                 (ulong)(uint)tAreaMax_local);
          printf("Limits: max delay =  %.2f, max area =  %.2f, time limit = %d sec.\n",
                 (double)*(float *)(ppGates + 3),(double)*(float *)((long)ppGates + 0x1c),
                 (ulong)*(uint *)(ppGates + 0x1a));
        }
        clk._0_4_ = 1;
        while (((int)(uint)clk <= (int)tDelayMax_local &&
               ((ppGates[0x1b] == (Mio_Gate_t *)0x0 ||
                (aVar4 = Abc_Clock(), aVar4 <= (long)ppGates[0x1b]))))) {
          aVar4 = Abc_Clock();
          Super_Compute((Super_Man_t *)ppGates,_Level,clk._4_4_,(int)tAreaMax_local,vStr._4_4_);
          *(uint *)(ppGates + 2) = (uint)clk;
          if (fVerbose != 0) {
            printf("Lev %d: Try =%12d. Add =%6d. Rem =%5d. Save =%6d. Lookups =%12d. Aliases =%12d. "
                   ,(ulong)(uint)clk,(ulong)*(uint *)(ppGates + 0x15),
                   (ulong)*(uint *)((long)ppGates + 0xac),(ulong)*(uint *)(ppGates + 0x16),
                   (ulong)(uint)(*(int *)((long)ppGates + 0xac) - *(int *)(ppGates + 0x16)),
                   *(undefined4 *)((long)ppGates + 0xbc),*(undefined4 *)(ppGates + 0x18));
            Abc_Print(1,"%s =","Time");
            aVar5 = Abc_Clock();
            Abc_Print(1,"%9.2f sec\n",((double)(aVar5 - aVar4) * 1.0) / 1000000.0);
            fflush(_stdout);
          }
          clk._0_4_ = (uint)clk + 1;
        }
        aVar4 = Abc_Clock();
        ppGates[0x19] = (Mio_Gate_t *)(aVar4 - aVar3);
        if (fVerbose != 0) {
          printf("Writing the output file...\n");
          fflush(_stdout);
        }
        pMan = (Super_Man_t *)Super_Write((Super_Man_t *)ppGates);
        Super_ManStop((Super_Man_t *)ppGates);
        if (_Level != (Mio_Gate_t **)0x0) {
          free(_Level);
        }
        pLibGen_local = (Mio_Library_t *)pMan;
      }
    }
    else {
      fprintf(_stderr,
              "Erro! The number of supergates requested (%d) in less than the number of variables (%d).\n"
              ,(ulong)(uint)nGatesMax,(ulong)(uint)nVarsMax);
      fprintf(_stderr,"The library cannot be computed.\n");
      pLibGen_local = (Mio_Library_t *)0x0;
    }
    return (Vec_Str_t *)pLibGen_local;
  }
  __assert_fail("nVarsMax < 7",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/super/superGate.c"
                ,0xb4,
                "Vec_Str_t *Super_PrecomputeStr(Mio_Library_t *, int, int, int, float, float, int, int, int)"
               );
}

Assistant:

Vec_Str_t * Super_PrecomputeStr( Mio_Library_t * pLibGen, int nVarsMax, int nLevels, int nGatesMax, float tDelayMax, float tAreaMax, int TimeLimit, int fSkipInv, int fVerbose )
{
    Vec_Str_t * vStr;
    Super_Man_t * pMan;
    Mio_Gate_t ** ppGates;
    int nGates, Level;
    abctime clk, clockStart;

    assert( nVarsMax < 7 );
    if ( nGatesMax && nGatesMax < nVarsMax )
    {
        fprintf( stderr, "Erro! The number of supergates requested (%d) in less than the number of variables (%d).\n", nGatesMax, nVarsMax );
        fprintf( stderr, "The library cannot be computed.\n" );
        return NULL;
    }

    // get the root gates
    ppGates = Mio_CollectRoots( pLibGen, nVarsMax, tDelayMax, 0, &nGates, fVerbose );
    if ( nGatesMax && nGates >= nGatesMax )
    {
        fprintf( stdout, "Warning! Genlib library contains more gates than can be computed.\n");
        fprintf( stdout, "Only one-gate supergates are included in the supergate library.\n" );
    }

    // start the manager
    pMan = Super_ManStart();
    pMan->pName     = Mio_LibraryReadName(pLibGen);
    pMan->nGatesMax = nGatesMax;
    pMan->fSkipInv  = fSkipInv;
    pMan->tDelayMax = tDelayMax;
    pMan->tAreaMax  = tAreaMax;
    pMan->TimeLimit = TimeLimit; // in seconds
    pMan->TimeStop  = TimeLimit ? TimeLimit * CLOCKS_PER_SEC + Abc_Clock() : 0; // in CPU ticks
    pMan->fVerbose  = fVerbose;

    if ( nGates == 0 )
    {
        fprintf( stderr, "Error: No genlib gates satisfy the limits criteria. Stop.\n");
        fprintf( stderr, "Limits: max delay =  %.2f, max area =  %.2f, time limit = %d sec.\n", 
            pMan->tDelayMax, pMan->tAreaMax, pMan->TimeLimit );

        // stop the manager
        Super_ManStop( pMan );
        ABC_FREE( ppGates );

        return NULL;
    }

    // get the starting supergates
    Super_First( pMan, nVarsMax );

    // perform the computation of supergates
    clockStart = Abc_Clock();
if ( fVerbose )
{
    printf( "Computing supergates with %d inputs, %d levels, and %d max gates.\n", 
        pMan->nVarsMax, nLevels, nGatesMax );
    printf( "Limits: max delay =  %.2f, max area =  %.2f, time limit = %d sec.\n", 
        pMan->tDelayMax, pMan->tAreaMax, pMan->TimeLimit );
}

    for ( Level = 1; Level <= nLevels; Level++ )
    {
        if ( pMan->TimeStop && Abc_Clock() > pMan->TimeStop )
            break;
clk = Abc_Clock();
        Super_Compute( pMan, ppGates, nGates, nGatesMax, fSkipInv );
        pMan->nLevels = Level;
if ( fVerbose )
{
        printf( "Lev %d: Try =%12d. Add =%6d. Rem =%5d. Save =%6d. Lookups =%12d. Aliases =%12d. ",
           Level, pMan->nTried, pMan->nAdded, pMan->nRemoved, pMan->nAdded - pMan->nRemoved, pMan->nLookups, pMan->nAliases );
ABC_PRT( "Time", Abc_Clock() - clk );
fflush( stdout );
}
    }
    pMan->Time = Abc_Clock() - clockStart;

if ( fVerbose )
{
printf( "Writing the output file...\n" );
fflush( stdout );
}
    // write them into a file
    vStr = Super_Write( pMan );

    // stop the manager
    Super_ManStop( pMan );
    ABC_FREE( ppGates );
    return vStr;
}